

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_cost_model_impl.h
# Opt level: O0

double __thiscall
cost_model::UnitCostModelJSON<label::JSONLabel>::ren
          (UnitCostModelJSON<label::JSONLabel> *this,int label_id_1,int label_id_2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  JSONLabel *pJVar4;
  string *psVar5;
  int label_id_2_local;
  int label_id_1_local;
  UnitCostModelJSON<label::JSONLabel> *this_local;
  
  pJVar4 = label::LabelDictionary<label::JSONLabel>::get(this->ld_,label_id_1);
  uVar1 = label::JSONLabel::get_type(pJVar4);
  pJVar4 = label::LabelDictionary<label::JSONLabel>::get(this->ld_,label_id_2);
  uVar2 = label::JSONLabel::get_type(pJVar4);
  if (uVar1 == uVar2) {
    pJVar4 = label::LabelDictionary<label::JSONLabel>::get(this->ld_,label_id_1);
    psVar5 = label::JSONLabel::get_label_abi_cxx11_(pJVar4);
    pJVar4 = label::LabelDictionary<label::JSONLabel>::get(this->ld_,label_id_2);
    label::JSONLabel::get_label_abi_cxx11_(pJVar4);
    iVar3 = std::__cxx11::string::compare((string *)psVar5);
    if (iVar3 == 0) {
      this_local = (UnitCostModelJSON<label::JSONLabel> *)0x0;
    }
    else {
      this_local = (UnitCostModelJSON<label::JSONLabel> *)0x3ff0000000000000;
    }
  }
  else {
    this_local = (UnitCostModelJSON<label::JSONLabel> *)std::numeric_limits<double>::infinity();
  }
  return (double)this_local;
}

Assistant:

double UnitCostModelJSON<Label>::ren(const int label_id_1,
    const int label_id_2) const {
  if (ld_.get(label_id_1).get_type() != ld_.get(label_id_2).get_type())
    return std::numeric_limits<double>::infinity();

  if (ld_.get(label_id_1).get_label().compare(ld_.get(label_id_2).get_label()) 
      == 0)
    return 0.0;
  else
    return 1.0;
}